

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeTestsUtil.cpp
# Opt level: O0

VkBufferImageCopy * __thiscall
vkt::compute::makeBufferImageCopy
          (VkBufferImageCopy *__return_storage_ptr__,compute *this,VkExtent3D extent,
          deUint32 arraySize)

{
  VkImageSubresourceLayers VVar1;
  VkOffset3D VVar2;
  VkBufferImageCopy *copyParams;
  undefined8 local_40;
  deInt32 local_38;
  deUint32 arraySize_local;
  VkExtent3D extent_local;
  
  __return_storage_ptr__->bufferOffset = 0;
  __return_storage_ptr__->bufferRowLength = 0;
  __return_storage_ptr__->bufferImageHeight = 0;
  VVar1 = ::vk::makeImageSubresourceLayers(1,0,0,extent.depth);
  __return_storage_ptr__->imageSubresource = VVar1;
  VVar2 = ::vk::makeOffset3D(0,0,0);
  local_40 = VVar2._0_8_;
  (__return_storage_ptr__->imageOffset).x = (undefined4)local_40;
  (__return_storage_ptr__->imageOffset).y = local_40._4_4_;
  local_38 = VVar2.z;
  (__return_storage_ptr__->imageOffset).z = local_38;
  *(compute **)&__return_storage_ptr__->imageExtent = this;
  (__return_storage_ptr__->imageExtent).depth = extent.width;
  return __return_storage_ptr__;
}

Assistant:

VkBufferImageCopy makeBufferImageCopy (const VkExtent3D extent,
									   const deUint32	arraySize)
{
	const VkBufferImageCopy copyParams =
	{
		0ull,																		//	VkDeviceSize				bufferOffset;
		0u,																			//	deUint32					bufferRowLength;
		0u,																			//	deUint32					bufferImageHeight;
		makeImageSubresourceLayers(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 0u, arraySize),	//	VkImageSubresourceLayers	imageSubresource;
		makeOffset3D(0, 0, 0),														//	VkOffset3D					imageOffset;
		extent,																		//	VkExtent3D					imageExtent;
	};
	return copyParams;
}